

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printSummaryDivider(ConsoleReporter *this)

{
  ostream *poVar1;
  undefined8 in_RAX;
  size_t sVar2;
  undefined8 uStack_18;
  
  poVar1 = (ostream *)(this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)45>()::line == '\0') {
    uRam00000000001f66d0 = 0x2d2d2d2d2d2d2d;
    uRam00000000001f66d7._0_1_ = '-';
    uRam00000000001f66d7._1_1_ = '-';
    uRam00000000001f66d7._2_1_ = '-';
    uRam00000000001f66d7._3_1_ = '-';
    uRam00000000001f66d7._4_1_ = '-';
    uRam00000000001f66d7._5_1_ = '-';
    uRam00000000001f66d7._6_1_ = '-';
    uRam00000000001f66d7._7_1_ = '-';
    DAT_001f66c0 = '-';
    DAT_001f66c0_1._0_1_ = '-';
    DAT_001f66c0_1._1_1_ = '-';
    DAT_001f66c0_1._2_1_ = '-';
    DAT_001f66c0_1._3_1_ = '-';
    DAT_001f66c0_1._4_1_ = '-';
    DAT_001f66c0_1._5_1_ = '-';
    DAT_001f66c0_1._6_1_ = '-';
    uRam00000000001f66c8 = 0x2d2d2d2d2d2d2d;
    DAT_001f66cf = 0x2d;
    DAT_001f66b0 = '-';
    DAT_001f66b0_1._0_1_ = '-';
    DAT_001f66b0_1._1_1_ = '-';
    DAT_001f66b0_1._2_1_ = '-';
    DAT_001f66b0_1._3_1_ = '-';
    DAT_001f66b0_1._4_1_ = '-';
    DAT_001f66b0_1._5_1_ = '-';
    DAT_001f66b0_1._6_1_ = '-';
    uRam00000000001f66b8._0_1_ = '-';
    uRam00000000001f66b8._1_1_ = '-';
    uRam00000000001f66b8._2_1_ = '-';
    uRam00000000001f66b8._3_1_ = '-';
    uRam00000000001f66b8._4_1_ = '-';
    uRam00000000001f66b8._5_1_ = '-';
    uRam00000000001f66b8._6_1_ = '-';
    uRam00000000001f66b8._7_1_ = '-';
    DAT_001f66a0 = '-';
    DAT_001f66a0_1._0_1_ = '-';
    DAT_001f66a0_1._1_1_ = '-';
    DAT_001f66a0_1._2_1_ = '-';
    DAT_001f66a0_1._3_1_ = '-';
    DAT_001f66a0_1._4_1_ = '-';
    DAT_001f66a0_1._5_1_ = '-';
    DAT_001f66a0_1._6_1_ = '-';
    uRam00000000001f66a8._0_1_ = '-';
    uRam00000000001f66a8._1_1_ = '-';
    uRam00000000001f66a8._2_1_ = '-';
    uRam00000000001f66a8._3_1_ = '-';
    uRam00000000001f66a8._4_1_ = '-';
    uRam00000000001f66a8._5_1_ = '-';
    uRam00000000001f66a8._6_1_ = '-';
    uRam00000000001f66a8._7_1_ = '-';
    getLineOfChars<(char)45>()::line = '-';
    getLineOfChars<(char)45>()::line_1._0_1_ = '-';
    getLineOfChars<(char)45>()::line_1._1_1_ = '-';
    getLineOfChars<(char)45>()::line_1._2_1_ = '-';
    getLineOfChars<(char)45>()::line_1._3_1_ = '-';
    getLineOfChars<(char)45>()::line_1._4_1_ = '-';
    getLineOfChars<(char)45>()::line_1._5_1_ = '-';
    getLineOfChars<(char)45>()::line_1._6_1_ = '-';
    uRam00000000001f6698._0_1_ = '-';
    uRam00000000001f6698._1_1_ = '-';
    uRam00000000001f6698._2_1_ = '-';
    uRam00000000001f6698._3_1_ = '-';
    uRam00000000001f6698._4_1_ = '-';
    uRam00000000001f6698._5_1_ = '-';
    uRam00000000001f6698._6_1_ = '-';
    uRam00000000001f6698._7_1_ = '-';
    DAT_001f66df = 0;
  }
  uStack_18 = in_RAX;
  sVar2 = strlen(&getLineOfChars<(char)45>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)45>()::line,sVar2)
  ;
  uStack_18 = CONCAT17(10,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_18 + 7),1);
  return;
}

Assistant:

void ConsoleReporter::printSummaryDivider() {
    stream << getLineOfChars<'-'>() << '\n';
}